

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

void compute_color_line_STDEV(uchar *uncompressed,int channels,float *point,float *direction)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if (channels < 1) {
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar8 = 0.0;
    fVar16 = 0.0;
    fVar15 = 0.0;
    fVar14 = 0.0;
    fVar13 = 0.0;
    fVar11 = 0.0;
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar3 = 0;
    fVar11 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar8 = 0.0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    do {
      bVar1 = uncompressed[lVar3];
      fVar10 = fVar10 + (float)bVar1;
      uVar4 = (uint)bVar1;
      fVar16 = fVar16 + (float)(bVar1 * uVar4);
      bVar1 = uncompressed[lVar3 + 1];
      bVar2 = uncompressed[lVar3 + 2];
      uVar5 = (uint)bVar2;
      fVar9 = fVar9 + (float)bVar1;
      uVar6 = (uint)bVar1;
      fVar15 = fVar15 + (float)(uVar6 * uVar6);
      fVar8 = fVar8 + (float)uVar5;
      fVar14 = fVar14 + (float)(uVar5 * uVar5);
      fVar13 = fVar13 + (float)(bVar1 * uVar4);
      fVar11 = fVar11 + (float)(uVar4 * bVar2);
      fVar7 = fVar7 + (float)(bVar2 * uVar6);
      lVar3 = lVar3 + (ulong)(uint)channels;
    } while ((int)lVar3 < channels * 0x10);
    fVar10 = fVar10 * 0.0625;
    fVar9 = fVar9 * 0.0625;
    fVar8 = fVar8 * 0.0625;
  }
  fVar17 = fVar10 * -16.0;
  fVar16 = fVar17 * fVar10 + fVar16;
  fVar15 = fVar9 * -16.0 * fVar9 + fVar15;
  fVar14 = fVar8 * -16.0 * fVar8 + fVar14;
  fVar13 = fVar17 * fVar9 + fVar13;
  fVar11 = fVar17 * fVar8 + fVar11;
  fVar7 = fVar9 * -16.0 * fVar8 + fVar7;
  *point = fVar10;
  point[1] = fVar9;
  point[2] = fVar8;
  fVar10 = fVar11 * 3.1415927 + fVar13 * 2.7182817 + fVar16;
  fVar12 = fVar7 * 3.1415927 + fVar15 * 2.7182817 + fVar13;
  fVar8 = fVar14 * 3.1415927 + fVar7 * 2.7182817 + fVar11;
  fVar9 = fVar8 * fVar11 + fVar10 * fVar16 + fVar13 * fVar12;
  fVar17 = fVar8 * fVar7 + fVar10 * fVar13 + fVar15 * fVar12;
  fVar8 = fVar8 * fVar14 + fVar10 * fVar11 + fVar12 * fVar7;
  *direction = fVar8 * fVar11 + fVar16 * fVar9 + fVar13 * fVar17;
  direction[1] = fVar8 * fVar7 + fVar15 * fVar17 + fVar9 * fVar13;
  direction[2] = fVar8 * fVar14 + fVar9 * fVar11 + fVar17 * fVar7;
  return;
}

Assistant:

void compute_color_line_STDEV(
		const unsigned char *const uncompressed,
		int channels,
		float point[3], float direction[3] )
{
	const float inv_16 = 1.0f / 16.0f;
	int i;
	float sum_r = 0.0f, sum_g = 0.0f, sum_b = 0.0f;
	float sum_rr = 0.0f, sum_gg = 0.0f, sum_bb = 0.0f;
	float sum_rg = 0.0f, sum_rb = 0.0f, sum_gb = 0.0f;
	/*	calculate all data needed for the covariance matrix
		( to compare with _rygdxt code)	*/
	for( i = 0; i < 16*channels; i += channels )
	{
		sum_r += uncompressed[i+0];
		sum_rr += uncompressed[i+0] * uncompressed[i+0];
		sum_g += uncompressed[i+1];
		sum_gg += uncompressed[i+1] * uncompressed[i+1];
		sum_b += uncompressed[i+2];
		sum_bb += uncompressed[i+2] * uncompressed[i+2];
		sum_rg += uncompressed[i+0] * uncompressed[i+1];
		sum_rb += uncompressed[i+0] * uncompressed[i+2];
		sum_gb += uncompressed[i+1] * uncompressed[i+2];
	}
	/*	convert the sums to averages	*/
	sum_r *= inv_16;
	sum_g *= inv_16;
	sum_b *= inv_16;
	/*	and convert the squares to the squares of the value - avg_value	*/
	sum_rr -= 16.0f * sum_r * sum_r;
	sum_gg -= 16.0f * sum_g * sum_g;
	sum_bb -= 16.0f * sum_b * sum_b;
	sum_rg -= 16.0f * sum_r * sum_g;
	sum_rb -= 16.0f * sum_r * sum_b;
	sum_gb -= 16.0f * sum_g * sum_b;
	/*	the point on the color line is the average	*/
	point[0] = sum_r;
	point[1] = sum_g;
	point[2] = sum_b;
	#if USE_COV_MAT
	/*
		The following idea was from ryg.
		(https://mollyrocket.com/forums/viewtopic.php?t=392)
		The method worked great (less RMSE than mine) most of
		the time, but had some issues handling some simple
		boundary cases, like full green next to full red,
		which would generate a covariance matrix like this:

		| 1  -1  0 |
		| -1  1  0 |
		| 0   0  0 |

		For a given starting vector, the power method can
		generate all zeros!  So no starting with {1,1,1}
		as I was doing!  This kind of error is still a
		slight posibillity, but will be very rare.
	*/
	/*	use the covariance matrix directly
		(1st iteration, don't use all 1.0 values!)	*/
	sum_r = 1.0f;
	sum_g = 2.718281828f;
	sum_b = 3.141592654f;
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	2nd iteration, use results from the 1st guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	3rd iteration, use results from the 2nd guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	#else
	/*	use my standard deviation method
		(very robust, a tiny bit slower and less accurate)	*/
	direction[0] = sqrt( sum_rr );
	direction[1] = sqrt( sum_gg );
	direction[2] = sqrt( sum_bb );
	/*	which has a greater component	*/
	if( sum_gg > sum_rr )
	{
		/*	green has greater component, so base the other signs off of green	*/
		if( sum_rg < 0.0f )
		{
			direction[0] = -direction[0];
		}
		if( sum_gb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	} else
	{
		/*	red has a greater component	*/
		if( sum_rg < 0.0f )
		{
			direction[1] = -direction[1];
		}
		if( sum_rb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	}
	#endif
}